

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O2

Vec_Str_t * Gia_ManToBridgeVec(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  Vec_Str_t *vStr;
  Gia_Man_t *p_00;
  char *__assertion;
  uint uVar4;
  int iVar5;
  
  if (p->vCos->nSize <= p->nRegs) {
    __assertion = "Gia_ManPoNum(p) > 0";
    uVar4 = 0x4a;
LAB_001caa17:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                  ,uVar4,"Vec_Str_t *Gia_ManToBridgeVec(Gia_Man_t *)");
  }
  p->pObjs->Value = 3;
  iVar5 = 0;
  while( true ) {
    uVar4 = iVar5 + 2;
    p_00 = (Gia_Man_t *)p->vCis;
    if (*(int *)((long)&p_00->pName + 4) <= iVar5) break;
    iVar1 = Vec_IntEntry((Vec_Int_t *)p_00,iVar5);
    p_00 = p;
    pGVar3 = Gia_ManObj(p,iVar1);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    uVar4 = Abc_Var2Lit(uVar4,0);
    pGVar3->Value = uVar4;
    iVar5 = iVar5 + 1;
  }
  for (iVar5 = 0; iVar1 = (int)p_00, iVar5 < p->nObjs; iVar5 = iVar5 + 1) {
    p_00 = p;
    pGVar3 = Gia_ManObj(p,iVar5);
    iVar1 = (int)p_00;
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar3 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar3) {
      p_00 = (Gia_Man_t *)(ulong)uVar4;
      uVar2 = Abc_Var2Lit(uVar4,0);
      pGVar3->Value = uVar2;
      uVar4 = uVar4 + 1;
    }
  }
  vStr = Vec_StrAlloc(iVar1);
  Gia_AigerWriteUnsigned(vStr,p->vCis->nSize - p->nRegs);
  Gia_AigerWriteUnsigned(vStr,p->nRegs);
  Gia_AigerWriteUnsigned(vStr,~(p->vCos->nSize + p->vCis->nSize) + p->nObjs);
  iVar5 = 0;
  while ((iVar5 < p->nObjs && (pGVar3 = Gia_ManObj(p,iVar5), pGVar3 != (Gia_Obj_t *)0x0))) {
    if ((~*(uint *)pGVar3 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar3) {
      uVar4 = Gia_ObjFanin0Copy(pGVar3);
      uVar2 = (uint)((ulong)*(undefined8 *)pGVar3 >> 0x20);
      uVar2 = Abc_LitNotCond(pGVar3[-(ulong)(uVar2 & 0x1fffffff)].Value,uVar2 >> 0x1d & 1);
      if (uVar4 == uVar2) {
        __assertion = "uLit0 != uLit1";
        uVar4 = 0x60;
        goto LAB_001caa17;
      }
      Gia_AigerWriteUnsigned(vStr,uVar4 * 2);
      Gia_AigerWriteUnsigned(vStr,uVar2);
    }
    iVar5 = iVar5 + 1;
  }
  iVar5 = 0;
  do {
    iVar1 = p->nRegs;
    if (iVar1 <= iVar5) {
LAB_001ca9ab:
      Gia_AigerWriteUnsigned(vStr,p->vCos->nSize - iVar1);
      iVar5 = 0;
      while( true ) {
        if (p->vCos->nSize - p->nRegs <= iVar5) {
          return vStr;
        }
        pGVar3 = Gia_ManCo(p,iVar5);
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        uVar4 = Gia_ObjFanin0Copy(pGVar3);
        Gia_AigerWriteUnsigned(vStr,uVar4 ^ 1);
        iVar5 = iVar5 + 1;
      }
      return vStr;
    }
    pGVar3 = Gia_ManCo(p,(p->vCos->nSize - iVar1) + iVar5);
    if (pGVar3 == (Gia_Obj_t *)0x0) {
      iVar1 = p->nRegs;
      goto LAB_001ca9ab;
    }
    iVar1 = Gia_ObjFanin0Copy(pGVar3);
    Gia_AigerWriteUnsigned(vStr,iVar1 * 4 + 2);
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

Vec_Str_t * Gia_ManToBridgeVec( Gia_Man_t * p )
{
    Vec_Str_t * vStr;
    Gia_Obj_t * pObj;
    int i, uLit0, uLit1, nNodes;
    assert( Gia_ManPoNum(p) > 0 );

    // start with const1 node (number 1)
    nNodes = 1;
    // assign literals(!!!) to the value field
    Gia_ManConst0(p)->Value = Abc_Var2Lit( nNodes++, 1 );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Abc_Var2Lit( nNodes++, 0 );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Abc_Var2Lit( nNodes++, 0 );

    // write header
    vStr = Vec_StrAlloc( 1000 );
    Gia_AigerWriteUnsigned( vStr, Gia_ManPiNum(p) );
    Gia_AigerWriteUnsigned( vStr, Gia_ManRegNum(p) );
    Gia_AigerWriteUnsigned( vStr, Gia_ManAndNum(p) );

    // write the nodes 
    Gia_ManForEachAnd( p, pObj, i )
    {
        uLit0 = Gia_ObjFanin0Copy( pObj );
        uLit1 = Gia_ObjFanin1Copy( pObj );
        assert( uLit0 != uLit1 );
        Gia_AigerWriteUnsigned( vStr, uLit0 << 1 );
        Gia_AigerWriteUnsigned( vStr, uLit1 );
    }

    // write latch drivers
    Gia_ManForEachRi( p, pObj, i )
    {
        uLit0 = Gia_ObjFanin0Copy( pObj );
        Gia_AigerWriteUnsigned( vStr, (uLit0 << 2) | BRIDGE_VALUE_0 );
    }

    // write PO drivers
    Gia_AigerWriteUnsigned( vStr, Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
        uLit0 = Gia_ObjFanin0Copy( pObj );
        // complement property output!!!
        Gia_AigerWriteUnsigned( vStr, Abc_LitNot(uLit0) );
    }
    return vStr;
}